

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GPUShader5ImagesArrayIndexing::iterate(GPUShader5ImagesArrayIndexing *this)

{
  ostringstream *this_00;
  uint uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLuint *pGVar5;
  char *description;
  long lVar6;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint index;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(this->m_program_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xae);
  uVar7 = 0;
  do {
    (**(code **)(lVar4 + 0x80))(uVar7 & 0xffffffff,this->m_to_ids[uVar7],0,0,0,0x88ba,0x8236);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not bind a texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xb5);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 4);
  (**(code **)(lVar4 + 0x528))(1,1,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Failed to dispatch compute operation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xbb);
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo_id);
  (**(code **)(lVar4 + 0x78))(0x8ca8,this->m_fbo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not create framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xc1);
  lVar8 = 0;
  (**(code **)(lVar4 + 0x1a00))(0,0,this->m_texture_width,this->m_texture_height);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glViewport() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xc5);
  pGVar5 = (GLuint *)
           operator_new__((ulong)(uint)(this->m_texture_width * this->m_texture_height * 4) << 2);
  this->m_data_buffer = pGVar5;
  (**(code **)(lVar4 + 0xdb8))(0x80);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not set memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xcc);
  do {
    (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_to_ids[lVar8],0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error configuring color attachment for framebuffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xd2);
    (**(code **)(lVar4 + 0x1220))
              (0,0,this->m_texture_width,this->m_texture_height,0x8d99,0x1405,this->m_data_buffer);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixels() call failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xd7);
    if (0 < (long)this->m_texture_height) {
      uVar1 = this->m_texture_width;
      uVar7 = lVar8 + 1U & 0xffffffff;
      lVar6 = 0;
      do {
        if (0 < (int)uVar1) {
          iVar2 = 0;
          uVar9 = 0;
          do {
            if ((int)uVar7 + (int)uVar9 !=
                this->m_data_buffer[(long)(int)(uVar1 * 4 * (int)lVar6) + (long)iVar2]) {
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Invalid image data acquired for image at index ",0x2f);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,", position: (",0xd);
              std::ostream::operator<<(this_00,(int)uVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
              std::ostream::operator<<(this_00,(int)lVar6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,". Rendered data [",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00," Expected data [",0x10);
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              if (this->m_data_buffer != (GLuint *)0x0) {
                operator_delete__(this->m_data_buffer);
              }
              this->m_data_buffer = (GLuint *)0x0;
              this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
              description = "Fail";
              testResult = QP_TEST_RESULT_FAIL;
              goto LAB_00d23e83;
            }
            uVar9 = uVar9 + 1;
            iVar2 = iVar2 + 4;
          } while (uVar1 != uVar9);
        }
        lVar6 = lVar6 + 1;
        uVar7 = uVar7 + 1;
      } while (lVar6 != this->m_texture_height);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if (this->m_data_buffer != (GLuint *)0x0) {
    operator_delete__(this->m_data_buffer);
  }
  this->m_data_buffer = (GLuint *)0x0;
  this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00d23e83:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5ImagesArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	for (glw::GLuint index = 0; index < m_array_size; index++)
	{
		gl.bindImageTexture(index /* unit */, m_to_ids[index], 0 /* level */, GL_FALSE, /* layered */
							0,															/* layer */
							GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a texture object to image unit!");
	}

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch compute operation");

	/* Create and configure a framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer object");

	/* Set viewport */
	gl.viewport(0, 0, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed");

	/* Allocate space for result data */
	const glw::GLuint dataSize = m_texture_width * m_texture_height * m_texture_n_components * 4;
	m_data_buffer			   = new glw::GLuint[dataSize];

	gl.memoryBarrier(GL_PIXEL_BUFFER_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	for (unsigned int i = 0; i < m_array_size; ++i)
	{
		/* Attach texture to framebuffer's color attachment 0 */
		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_ids[i], 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring color attachment for framebuffer object!");

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
					  m_data_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed!");

		glw::GLuint resultExpected[m_texture_n_components];

		/* Loop over all pixels and compare the rendered data with reference value */
		for (glw::GLint y = 0; y < m_texture_height; ++y)
		{
			glw::GLuint* data_row = m_data_buffer + y * m_texture_width * m_texture_n_components * 4;

			for (glw::GLint x = 0; x < m_texture_width; ++x)
			{
				glw::GLuint* data = data_row + x * m_texture_n_components * 4;

				resultExpected[0] = x + y + 1 + i;

				if (resultExpected[0] != data[0])
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid image data acquired for image at index "
									   << i << ", position: (" << x << "," << y << ")"
									   << ". Rendered data [" << data[0] << "]"
									   << " Expected data [" << resultExpected[0] << "]" << tcu::TestLog::EndMessage;

					delete[] m_data_buffer;
					m_data_buffer = DE_NULL;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				} /* if (data mismatch) */

			} /* for (all columns) */
		}	 /* for (all rows) */
	}		  /*for (m_sizeOfArray)*/

	delete[] m_data_buffer;
	m_data_buffer = DE_NULL;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}